

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Events.c
# Opt level: O1

void event_end_of_breakfast(tgestate_t *state)

{
  uint8_t *puVar1;
  long lVar2;
  long lVar3;
  
  state->bell = '(';
  if (state->hero_in_breakfast != '\0') {
    state->vischars[0].mi.mappos.u = 0x34;
    state->vischars[0].mi.mappos.v = 0x3e;
    state->hero_in_breakfast = '\0';
  }
  if (state->in_solitary == '\0') {
    puVar1 = &state->vischars[0].flags;
    *puVar1 = *puVar1 & 0xbf;
    state->vischars[0].route.index = 0x90;
    state->vischars[0].route.step = '\x03';
    set_route(state,state->vischars);
  }
  lVar2 = 0x1fd;
  do {
    lVar3 = lVar2;
    *(undefined1 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar3 + -0x20) = 0x19;
    lVar2 = lVar3 + 7;
  } while ((char)(lVar3 + 7) != '\x12');
  *(undefined1 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar3 + -0x19) = 0x17;
  *(undefined1 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar3 + -0x12) = 0x17;
  *(undefined1 *)((long)state->jmpbuf_main[0].__jmpbuf + lVar3 + -0xb) = 0x17;
  set_prisoners_and_guards_route_B(state,(route_t *)&end_of_breakfast_t2);
  set_roomdef(state,'\x17',0x25,0xd);
  set_roomdef(state,'\x17',0x28,0xd);
  set_roomdef(state,'\x17',0x2b,0xd);
  set_roomdef(state,'\x19',0x1d,0xd);
  set_roomdef(state,'\x19',0x20,0xd);
  set_roomdef(state,'\x19',0x23,0xd);
  set_roomdef(state,'\x19',0x26,0xd);
  if ((byte)(state->room_index - 1) < 0x1c) {
    setup_room(state);
    plot_interior_tiles(state);
    return;
  }
  return;
}

Assistant:

static void event_end_of_breakfast(tgestate_t *state)
{
  assert(state != NULL);

  state->bell = bell_RING_40_TIMES;
  end_of_breakfast(state);
}